

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcCoveringType::~IfcCoveringType(IfcCoveringType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this[-1].field_0x48 = 0x932db8;
  *(undefined8 *)&this->field_0x30 = 0x932ed0;
  *(undefined8 *)&this[-1].field_0xd0 = 0x932de0;
  *(undefined8 *)&this[-1].field_0xe0 = 0x932e08;
  *(undefined8 *)&this[-1].field_0x138 = 0x932e30;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCoveringType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x932e58;
  *(undefined8 *)&this[-1].field_0x1c8 = 0x932e80;
  *(undefined8 *)this = 0x932ea8;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x48 = 0x933198;
  *(undefined8 *)&this->field_0x30 = 0x933260;
  *(undefined8 *)&this[-1].field_0xd0 = 0x9331c0;
  *(undefined8 *)&this[-1].field_0xe0 = 0x9331e8;
  *(undefined8 *)&this[-1].field_0x138 = 0x933210;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCoveringType,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x933238;
  puVar1 = *(undefined1 **)
            &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCoveringType,_1UL>.field_0x10;
  if (puVar1 != &this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCoveringType,_1UL>.
                 field_0x20) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct
            ((IfcTypeProduct *)&this[-1].field_0x48,&PTR_construction_vtable_24__00932ef8);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcCoveringType() : Object("IfcCoveringType") {}